

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmListFileContext * __thiscall
cmMakefile::GetExecutionContext(cmListFileContext *__return_storage_ptr__,cmMakefile *this)

{
  cmCommandContext *lfcc;
  string sStack_38;
  
  lfcc = (this->ContextStack).
         super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
  cmState::Snapshot::GetExecutionListFile_abi_cxx11_(&sStack_38,&this->StateSnapshot);
  cmListFileContext::FromCommandContext(__return_storage_ptr__,lfcc,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmMakefile::GetExecutionContext() const
{
  return cmListFileContext::FromCommandContext(
        *this->ContextStack.back(),
        this->StateSnapshot.GetExecutionListFile());
}